

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_file_sink-inl.h
# Opt level: O2

filename_t *
spdlog::sinks::rotating_file_sink<spdlog::details::null_mutex>::calc_filename
          (filename_t *__return_storage_ptr__,filename_t *filename,size_t index)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  filename_t ext;
  filename_t basename;
  undefined1 *local_78;
  filename_t *local_70;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  
  if (index == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)filename);
  }
  else {
    basename._M_dataplus._M_p = (pointer)&basename.field_2;
    basename._M_string_length = 0;
    basename.field_2._M_local_buf[0] = '\0';
    ext._M_dataplus._M_p = (pointer)&ext.field_2;
    ext._M_string_length = 0;
    ext.field_2._M_local_buf[0] = '\0';
    details::file_helper::split_by_extension
              ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_68,filename);
    local_70 = &basename;
    local_78 = (undefined1 *)&ext;
    std::tuple<std::__cxx11::string&,std::__cxx11::string&>::operator=
              ((tuple<std::__cxx11::string&,std::__cxx11::string&> *)&local_78,
               (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_68);
    std::
    _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Tuple_impl(&local_68);
    local_68.
    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_dataplus._M_p = basename._M_dataplus._M_p;
    local_68.
    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_string_length = basename._M_string_length;
    local_68.
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_dataplus._M_p = ext._M_dataplus._M_p;
    local_68.
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_string_length = ext._M_string_length;
    fmt.size_ = 0xd4d;
    fmt.data_ = (char *)0x7;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_68;
    local_68.
    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl.field_2._M_allocated_capacity = index;
    ::fmt::v8::vformat_abi_cxx11_(__return_storage_ptr__,(v8 *)"{}.{}{}",fmt,args);
    std::__cxx11::string::~string((string *)&ext);
    std::__cxx11::string::~string((string *)&basename);
  }
  return __return_storage_ptr__;
}

Assistant:

SPDLOG_INLINE filename_t rotating_file_sink<Mutex>::calc_filename(const filename_t &filename, std::size_t index)
{
    if (index == 0u)
    {
        return filename;
    }

    filename_t basename, ext;
    std::tie(basename, ext) = details::file_helper::split_by_extension(filename);
    return fmt::format(SPDLOG_FILENAME_T("{}.{}{}"), basename, index, ext);
}